

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O1

QDBusMetaObject * __thiscall
QDBusConnectionPrivate::findMetaObject
          (QDBusConnectionPrivate *this,QString *service,QString *path,QString *interface,
          QDBusError *error)

{
  Data<QHashPrivate::Node<QString,_QDBusMetaObject_*>_> *pDVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  undefined8 uVar9;
  char cVar10;
  MessageType MVar11;
  ErrorType EVar12;
  Node<QString,_QDBusMetaObject_*> *pNVar13;
  QDBusMetaObject **ppQVar14;
  QDBusMetaObject *pQVar15;
  long in_FS_OFFSET;
  QDeadlineTimer QVar16;
  QDeadlineTimer QVar17;
  QByteArrayView QVar18;
  QStringView QVar19;
  QLatin1String QVar20;
  QDBusMessage reply;
  QDBusMessage msg;
  QArrayDataPointer<QVariant> local_c0;
  undefined1 local_a8 [8];
  QDBusMessage local_a0;
  QString local_98;
  QDBusError local_78;
  anon_union_8_2_e3826b46_for_QDBusConnectionPrivate_13 local_38;
  
  local_38 = *(anon_union_8_2_e3826b46_for_QDBusConnectionPrivate_13 *)(in_FS_OFFSET + 0x28);
  if ((interface->d).size != 0) {
    QVar16.t2 = 0xffffffff;
    QVar16.type = 0x7fffffff;
    QVar16.t1 = (qint64)&this->lock;
    QReadWriteLock::tryLockForRead(QVar16);
    pDVar1 = (this->cachedMetaObjects).d;
    if (pDVar1 == (Data<QHashPrivate::Node<QString,_QDBusMetaObject_*>_> *)0x0) {
LAB_0014d26c:
      ppQVar14 = (QDBusMetaObject **)0x0;
    }
    else {
      pNVar13 = QHashPrivate::Data<QHashPrivate::Node<QString,_QDBusMetaObject_*>_>::
                findNode<QString>(pDVar1,interface);
      if (pNVar13 == (Node<QString,_QDBusMetaObject_*> *)0x0) goto LAB_0014d26c;
      ppQVar14 = &pNVar13->value;
    }
    if (ppQVar14 == (QDBusMetaObject **)0x0) {
      pQVar15 = (QDBusMetaObject *)0x0;
    }
    else {
      pQVar15 = *ppQVar14;
    }
    QReadWriteLock::unlock();
    if (pQVar15 != (QDBusMetaObject *)0x0) goto LAB_0014d4f9;
  }
  if ((path->d).size == 0) {
    QVar18.m_data = (storage_type *)0x1b;
    QVar18.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar18);
    local_98.d.d = (Data *)local_78._0_8_;
    local_98.d.ptr = (char16_t *)local_78.msg.d.d;
    local_98.d.size = (qsizetype)local_78.msg.d.ptr;
    QDBusError::QDBusError(&local_78,InvalidObjectPath,&local_98);
    EVar12 = error->code;
    error->code = local_78.code;
    local_78.code = EVar12;
    pQVar6 = &((error->msg).d.d)->super_QArrayData;
    pcVar7 = (error->msg).d.ptr;
    (error->msg).d.d = local_78.msg.d.d;
    (error->msg).d.ptr = local_78.msg.d.ptr;
    pDVar2 = (Data *)(error->msg).d.size;
    (error->msg).d.size = local_78.msg.d.size;
    pQVar3 = &((error->nm).d.d)->super_QArrayData;
    pcVar4 = (error->nm).d.ptr;
    (error->nm).d.d = local_78.nm.d.d;
    (error->nm).d.ptr = local_78.nm.d.ptr;
    qVar5 = (error->nm).d.size;
    (error->nm).d.size = local_78.nm.d.size;
    local_78.msg.d.d = (Data *)pQVar6;
    local_78.msg.d.ptr = pcVar7;
    local_78.msg.d.size = (qsizetype)pDVar2;
    local_78.nm.d.d = (Data *)pQVar3;
    local_78.nm.d.ptr = pcVar4;
    local_78.nm.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (&(local_78.msg.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.msg.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDBusError::operator=(&this->lastError,error);
    pQVar15 = (QDBusMetaObject *)0x0;
    goto LAB_0014d4f9;
  }
  local_a0.d_ptr = (QDBusMessagePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = (QArrayData *)0x0;
  local_78.msg.d.d = (Data *)0x19bbf0;
  local_78.msg.d.ptr = (char16_t *)0x23;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = L"Introspect";
  local_98.d.size = 10;
  QDBusMessage::createMethodCall(&local_a0,service,path,(QString *)&local_78,&local_98);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
    }
  }
  (local_a0.d_ptr)->field_0xbc = (local_a0.d_ptr)->field_0xbc | 2;
  local_a8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  sendWithReply((QDBusConnectionPrivate *)local_a8,(QDBusMessage *)this,(CallMode)&local_a0,1);
  QVar17.t2 = 0xffffffff;
  QVar17.type = 0x7fffffff;
  QVar17.t1 = (qint64)&this->lock;
  QReadWriteLock::tryLockForWrite(QVar17);
  if ((interface->d).size == 0) {
LAB_0014d4d5:
    pQVar15 = (QDBusMetaObject *)0x0;
  }
  else {
    pDVar1 = (this->cachedMetaObjects).d;
    if (pDVar1 == (Data<QHashPrivate::Node<QString,_QDBusMetaObject_*>_> *)0x0) {
LAB_0014d4c9:
      ppQVar14 = (QDBusMetaObject **)0x0;
    }
    else {
      pNVar13 = QHashPrivate::Data<QHashPrivate::Node<QString,_QDBusMetaObject_*>_>::
                findNode<QString>(pDVar1,interface);
      if (pNVar13 == (Node<QString,_QDBusMetaObject_*> *)0x0) goto LAB_0014d4c9;
      ppQVar14 = &pNVar13->value;
    }
    if (ppQVar14 == (QDBusMetaObject **)0x0) goto LAB_0014d4d5;
    pQVar15 = *ppQVar14;
  }
  if (pQVar15 == (QDBusMetaObject *)0x0) {
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (char16_t *)0x0;
    local_98.d.size = 0;
    MVar11 = QDBusMessage::type((QDBusMessage *)local_a8);
    if (MVar11 == ReplyMessage) {
      QDBusMessage::signature((QString *)&local_78,(QDBusMessage *)local_a8);
      if (local_78.msg.d.ptr == (char16_t *)0x1) {
        QVar19.m_data = (storage_type_conflict *)local_78.msg.d.d;
        QVar19.m_size = 1;
        QVar20.m_data = "s";
        QVar20.m_size = 1;
        cVar10 = QtPrivate::equalStrings(QVar19,QVar20);
      }
      else {
        cVar10 = '\0';
      }
      if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
        }
      }
      if (cVar10 != '\0') {
        QDBusMessage::arguments((QList<QVariant> *)&local_c0,(QDBusMessage *)local_a8);
        QVariant::toString();
        pcVar7 = local_78.msg.d.ptr;
        uVar9 = local_78._0_8_;
        pcVar4 = local_98.d.ptr;
        pDVar8 = local_98.d.d;
        local_78._0_8_ = local_98.d.d;
        local_98.d.d = (Data *)uVar9;
        local_98.d.ptr = (char16_t *)local_78.msg.d.d;
        local_78.msg.d.d = (Data *)pcVar4;
        local_78.msg.d.ptr = (char16_t *)local_98.d.size;
        local_98.d.size = (qsizetype)pcVar7;
        if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_c0);
      }
LAB_0014d6ed:
      pQVar15 = QDBusMetaObject::createMetaObject
                          (interface,&local_98,&this->cachedMetaObjects,error);
      QDBusError::operator=(&this->lastError,error);
    }
    else {
      QDBusError::QDBusError(&local_78,(QDBusMessage *)local_a8);
      EVar12 = error->code;
      error->code = local_78.code;
      local_78.code = EVar12;
      pQVar6 = &((error->msg).d.d)->super_QArrayData;
      pcVar7 = (error->msg).d.ptr;
      (error->msg).d.d = local_78.msg.d.d;
      (error->msg).d.ptr = local_78.msg.d.ptr;
      pDVar2 = (Data *)(error->msg).d.size;
      (error->msg).d.size = local_78.msg.d.size;
      pQVar3 = &((error->nm).d.d)->super_QArrayData;
      pcVar4 = (error->nm).d.ptr;
      (error->nm).d.d = local_78.nm.d.d;
      (error->nm).d.ptr = local_78.nm.d.ptr;
      qVar5 = (error->nm).d.size;
      (error->nm).d.size = local_78.nm.d.size;
      local_78.msg.d.d = (Data *)pQVar6;
      local_78.msg.d.ptr = pcVar7;
      local_78.msg.d.size = (qsizetype)pDVar2;
      local_78.nm.d.d = (Data *)pQVar3;
      local_78.nm.d.ptr = pcVar4;
      local_78.nm.d.size = qVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      if (&(local_78.msg.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_78.msg.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDBusError::operator=(&this->lastError,error);
      MVar11 = QDBusMessage::type((QDBusMessage *)local_a8);
      if (MVar11 == ErrorMessage) {
        EVar12 = QDBusError::type(error);
        if (EVar12 == UnknownMethod) goto LAB_0014d6ed;
      }
      pQVar15 = (QDBusMetaObject *)0x0;
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QReadWriteLock::unlock();
  QDBusMessage::~QDBusMessage((QDBusMessage *)local_a8);
  QDBusMessage::~QDBusMessage(&local_a0);
LAB_0014d4f9:
  if (*(DBusConnection **)(in_FS_OFFSET + 0x28) == local_38.connection) {
    return pQVar15;
  }
  __stack_chk_fail();
}

Assistant:

QDBusMetaObject *
QDBusConnectionPrivate::findMetaObject(const QString &service, const QString &path,
                                       const QString &interface, QDBusError &error)
{
    // service must be a unique connection name
    if (!interface.isEmpty()) {
        QDBusReadLocker locker(FindMetaObject1Action, this);
        QDBusMetaObject *mo = cachedMetaObjects.value(interface, nullptr);
        if (mo)
            return mo;
    }
    if (path.isEmpty()) {
        error = QDBusError(QDBusError::InvalidObjectPath, "Object path cannot be empty"_L1);
        lastError = error;
        return nullptr;
    }

    // introspect the target object
    QDBusMessage msg = QDBusMessage::createMethodCall(service, path,
                                                QDBusUtil::dbusInterfaceIntrospectable(),
                                                QStringLiteral("Introspect"));
    QDBusMessagePrivate::setParametersValidated(msg, true);

    QDBusMessage reply = sendWithReply(msg, QDBus::Block);

    // it doesn't exist yet, we have to create it
    QDBusWriteLocker locker(FindMetaObject2Action, this);
    QDBusMetaObject *mo = nullptr;
    if (!interface.isEmpty())
        mo = cachedMetaObjects.value(interface, nullptr);
    if (mo)
        // maybe it got created when we switched from read to write lock
        return mo;

    QString xml;
    if (reply.type() == QDBusMessage::ReplyMessage) {
        if (reply.signature() == "s"_L1)
            // fetch the XML description
            xml = reply.arguments().at(0).toString();
    } else {
        error = QDBusError(reply);
        lastError = error;
        if (reply.type() != QDBusMessage::ErrorMessage || error.type() != QDBusError::UnknownMethod)
            return nullptr; // error
    }

    // release the lock and return
    QDBusMetaObject *result = QDBusMetaObject::createMetaObject(interface, xml,
                                                                cachedMetaObjects, error);
    lastError = error;
    return result;
}